

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeString::releaseBuffer(UnicodeString *this,int32_t newLength)

{
  int iVar1;
  char16_t *pcVar2;
  ushort uVar3;
  char16_t *pcVar4;
  
  uVar3 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (-2 < newLength && (uVar3 & 0x10) != 0) {
    iVar1 = 0x1b;
    if ((uVar3 & 2) == 0) {
      iVar1 = (this->fUnion).fFields.fCapacity;
    }
    if (newLength == -1) {
      if ((uVar3 & 2) == 0) {
        pcVar2 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar2 = (this->fUnion).fStackFields.fBuffer;
      }
      pcVar4 = pcVar2;
      if (0 < iVar1) {
        do {
          if (*pcVar4 == L'\0') break;
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 < pcVar2 + iVar1);
      }
      newLength = (int)((ulong)((long)pcVar4 - (long)pcVar2) >> 1);
    }
    else if (iVar1 < newLength) {
      newLength = iVar1;
    }
    if (newLength < 0x400) {
      uVar3 = (ushort)(newLength << 5) | uVar3 & 0x1f;
    }
    else {
      uVar3 = uVar3 | 0xffe0;
      (this->fUnion).fFields.fLength = newLength;
    }
    (this->fUnion).fStackFields.fLengthAndFlags = uVar3 & 0xffef;
  }
  return;
}

Assistant:

void
UnicodeString::releaseBuffer(int32_t newLength) {
  if(fUnion.fFields.fLengthAndFlags&kOpenGetBuffer && newLength>=-1) {
    // set the new fLength
    int32_t capacity=getCapacity();
    if(newLength==-1) {
      // the new length is the string length, capped by fCapacity
      const UChar *array=getArrayStart(), *p=array, *limit=array+capacity;
      while(p<limit && *p!=0) {
        ++p;
      }
      newLength=(int32_t)(p-array);
    } else if(newLength>capacity) {
      newLength=capacity;
    }
    setLength(newLength);
    fUnion.fFields.fLengthAndFlags&=~kOpenGetBuffer;
  }
}